

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O3

ostream * operator<<(ostream *outs,Index *i)

{
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  **ppBVar1;
  pointer pcVar2;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *pPVar3;
  ostream *poVar4;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *pBVar5;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *pPVar6;
  Iterator map_it;
  Iterator mmap_it;
  char local_89;
  Iterator local_88;
  Iterator local_78;
  char *local_68;
  long local_60;
  char local_58 [16];
  vector<long,_std::allocator<long>_> local_48;
  
  local_88 = BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
             ::begin((BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)i);
  if (local_88.node_ptr !=
      (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
       *)0x0) {
    do {
      while( true ) {
        pPVar3 = BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::Iterator::operator->(&local_88);
        pcVar2 = (pPVar3->key)._M_dataplus._M_p;
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar2,pcVar2 + (pPVar3->key)._M_string_length);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(outs,local_68,local_60);
        local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_48,1);
        if (local_68 != local_58) {
          operator_delete(local_68);
        }
        pPVar3 = BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                 ::Iterator::operator->(&local_88);
        local_78 = BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                   ::begin(&(pPVar3->value).tree);
        pBVar5 = local_78.node_ptr;
        while (pBVar5 != (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                          *)0x0) {
          while( true ) {
            local_68 = (char *)CONCAT71(local_68._1_7_,9);
            std::__ostream_insert<char,std::char_traits<char>>(outs,(char *)&local_68,1);
            pPVar6 = BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                     ::Iterator::operator->(&local_78);
            pcVar2 = (pPVar6->key)._M_dataplus._M_p;
            local_68 = local_58;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_68,pcVar2,pcVar2 + (pPVar6->key)._M_string_length);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>(outs,local_68,local_60);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
            pPVar6 = BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                     ::Iterator::operator->(&local_78);
            std::vector<long,_std::allocator<long>_>::vector(&local_48,&pPVar6->values);
            poVar4 = operator<<(poVar4,&local_48);
            local_89 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_89,1);
            if ((void *)CONCAT71(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start._1_7_,
                                 local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
              operator_delete((void *)CONCAT71(local_48.
                                               super__Vector_base<long,_std::allocator<long>_>.
                                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                                               local_48.
                                               super__Vector_base<long,_std::allocator<long>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_1_));
            }
            if (local_68 != local_58) {
              operator_delete(local_68);
            }
            if ((local_78.node_ptr)->data_size - 1 <= local_78.offset) break;
            local_78.offset = local_78.offset + 1;
          }
          pBVar5 = (local_78.node_ptr)->next;
          local_78.offset = 0;
          local_78.node_ptr = pBVar5;
        }
        if ((local_88.node_ptr)->data_size - 1 <= local_88.offset) break;
        local_88.offset = local_88.offset + 1;
      }
      ppBVar1 = &(local_88.node_ptr)->next;
      local_88.offset = 0;
      local_88.node_ptr = *ppBVar1;
    } while (*ppBVar1 !=
             (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              *)0x0);
  }
  return outs;
}

Assistant:

std::ostream& operator<<(std::ostream& outs, const Index& i) {
    for (auto map_it = i.index.begin(); map_it != nullptr; ++map_it) {
        outs << map_it.key() << '\n';
        for (auto mmap_it = map_it->begin(); mmap_it != nullptr; ++mmap_it) {
            outs << '\t';
            outs << mmap_it.key() << ": " << *mmap_it << '\n';
        }
    }
    return outs;
}